

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint32 __thiscall google::protobuf::io::CodedInputStream::ReadTagSlow(CodedInputStream *this)

{
  uint8 uVar1;
  uint8 *puVar2;
  bool bVar3;
  uint32 uVar4;
  uint64 result;
  uint64 local_10;
  
  if ((this->buffer_ == this->buffer_end_) && (bVar3 = Refresh(this), !bVar3)) {
    if (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_) {
      this->legitimate_message_end_ = true;
    }
    else {
      this->legitimate_message_end_ = this->current_limit_ == this->total_bytes_limit_;
    }
    return 0;
  }
  local_10 = 0;
  puVar2 = this->buffer_;
  if ((puVar2 < this->buffer_end_) && (uVar1 = *puVar2, -1 < (long)(char)uVar1)) {
    this->buffer_ = puVar2 + 1;
    bVar3 = true;
    local_10 = (long)(char)uVar1;
  }
  else {
    bVar3 = ReadVarint64Fallback(this,&local_10);
  }
  uVar4 = 0;
  if (bVar3 != false) {
    uVar4 = (uint32)local_10;
  }
  return uVar4;
}

Assistant:

uint32 CodedInputStream::ReadTagSlow() {
  if (buffer_ == buffer_end_) {
    // Call refresh.
    if (!Refresh()) {
      // Refresh failed.  Make sure that it failed due to EOF, not because
      // we hit total_bytes_limit_, which, unlike normal limits, is not a
      // valid place to end a message.
      int current_position = total_bytes_read_ - buffer_size_after_limit_;
      if (current_position >= total_bytes_limit_) {
        // Hit total_bytes_limit_.  But if we also hit the normal limit,
        // we're still OK.
        legitimate_message_end_ = current_limit_ == total_bytes_limit_;
      } else {
        legitimate_message_end_ = true;
      }
      return 0;
    }
  }

  // For the slow path, just do a 64-bit read. Try to optimize for one-byte tags
  // again, since we have now refreshed the buffer.
  uint64 result = 0;
  if (!ReadVarint64(&result)) return 0;
  return static_cast<uint32>(result);
}